

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbstrmatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_>::Clone
          (TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xb8);
  *(undefined ***)this_00 = &PTR__TPZSavable_019d5850;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + -0x60);
  *(undefined8 *)&this_00->field_0xa8 = 0x19d56e8;
  *(undefined8 *)this_00 = 0x19d57b0;
  *(undefined4 *)(this_00 + 1) =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1);
  this_00[1].field_0x4 =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019d5008,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x19d4dc8;
  *(undefined8 *)&this_00->field_0xa8 = 0x19d4f88;
  *(undefined8 *)&this_00->field_0xa0 = 0x19d4e88;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZBandStructMatrix(*this);
}